

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O3

bool __thiscall
kws::Generator::GenerateDart
          (Generator *this,char *dir,int maxError,bool group,string *url,double time,
          string *basedirectory)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  char *pcVar3;
  char cVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  undefined8 extraout_RAX;
  ulong uVar8;
  long *plVar9;
  undefined7 in_register_00000009;
  long *plVar10;
  char *format;
  char *format_00;
  undefined4 uVar11;
  uint uVar12;
  pointer __x;
  pointer pEVar13;
  bool bVar14;
  bool bVar15;
  string desc;
  string sourcefile;
  string dirname;
  string configname;
  string tag;
  string filename;
  string currentLine;
  ErrorVectorType errors;
  ofstream file;
  ifstream configfile;
  ifstream tagfile;
  undefined1 auStack_7d8 [4];
  undefined4 local_7d4;
  uint local_7d0;
  int local_7cc;
  Generator *local_7c8;
  string local_7c0;
  undefined4 local_7a0;
  int local_79c;
  string local_798;
  pointer local_778;
  long *local_770;
  long local_768;
  long local_760;
  long lStack_758;
  undefined1 *local_750;
  long local_748;
  undefined1 local_740 [16];
  string *local_730;
  char *local_728 [2];
  char local_718 [16];
  char *local_708 [2];
  char local_6f8 [16];
  long *local_6e8;
  long local_6e0;
  long local_6d8;
  long lStack_6d0;
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  double local_6a8;
  string *local_6a0;
  undefined1 *local_698;
  char *local_690;
  undefined1 local_688 [16];
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> local_678;
  string local_660;
  long local_640;
  filebuf local_638 [240];
  ios_base local_548 [264];
  long local_440 [65];
  long local_238 [65];
  
  local_7c8 = this;
  local_79c = maxError;
  local_730 = url;
  local_6a8 = time;
  local_6a0 = basedirectory;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating Dart...",0x12);
  std::__cxx11::string::string((string *)&local_750,dir,(allocator *)local_238);
  sVar5 = strlen(dir);
  if ((dir[sVar5 - 1] != '/') && (dir[sVar5 - 1] != '\\')) {
    std::__cxx11::string::append((char *)&local_750);
  }
  std::__cxx11::string::append((char *)&local_750);
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char*>((string *)local_708,local_750,local_750 + local_748);
  std::__cxx11::string::append((char *)local_708);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)local_708[0]);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot open file for reading: ",0x1e);
    pcVar6 = local_708[0];
    if (local_708[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
    }
    else {
      sVar5 = strlen(local_708[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    local_7d4 = 0;
  }
  else {
    pcVar6 = (char *)operator_new__(0xff);
    std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::istream::getline((char *)local_238,(long)pcVar6,-1);
    sVar5 = strlen(pcVar6);
    if (pcVar6[sVar5 - 1] == '\r') {
      pcVar6[sVar5 - 1] = '\0';
    }
    std::__cxx11::string::append((char *)&local_750);
    std::__cxx11::string::append((char *)&local_750);
    operator_delete__(pcVar6);
    local_728[0] = local_718;
    std::__cxx11::string::_M_construct<char*>((string *)local_728,local_750,local_750 + local_748);
    std::__cxx11::string::append((char *)local_728);
    std::ifstream::ifstream(local_440);
    std::ifstream::open((char *)local_440,(_Ios_Openmode)local_728[0]);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot open file for reading: ",0x1e);
      pcVar6 = local_728[0];
      if (local_728[0] == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
      }
      else {
        sVar5 = strlen(local_728[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      local_7d4 = 0;
    }
    else {
      std::ofstream::ofstream(&local_640);
      local_6c8[0] = local_6b8;
      std::__cxx11::string::_M_construct<char*>((string *)local_6c8,local_750,local_750 + local_748)
      ;
      std::__cxx11::string::append((char *)local_6c8);
      std::ofstream::open((char *)&local_640,(_Ios_Openmode)local_6c8[0]);
      local_7d4 = std::__basic_file<char>::is_open();
      if ((char)local_7d4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Cannot open file for writing: ",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
      else {
        pcVar6 = (char *)operator_new__(0xff);
        std::ios::widen((char)local_440 + (char)*(undefined8 *)(local_440[0] + -0x18));
        std::istream::getline((char *)local_440,(long)pcVar6,-1);
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,pcVar6,sVar5);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::ios::widen((char)local_440 + (char)*(undefined8 *)(local_440[0] + -0x18));
        std::istream::getline((char *)local_440,(long)pcVar6,-1);
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,pcVar6,sVar5);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        cVar4 = (char)(ostream *)&local_640;
        std::ostream::put(cVar4);
        std::ostream::flush();
        local_7a0 = (undefined4)CONCAT71(in_register_00000009,group);
        local_698 = local_688;
        sVar5 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,pcVar6,pcVar6 + sVar5);
        while (lVar7 = std::__cxx11::string::find((char *)&local_698,0x1759b2,0), lVar7 == -1) {
          std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
          std::istream::getline((char *)local_440,(long)pcVar6,-1);
          pcVar3 = local_690;
          strlen(pcVar6);
          std::__cxx11::string::_M_replace((ulong)&local_698,0,pcVar3,(ulong)pcVar6);
          sVar5 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,pcVar6,sVar5);
          std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
        }
        operator_delete__(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"<Build>",7);
        uVar11 = local_7a0;
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"      <StartDateTime>",0x15);
        kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
                  (&local_798,(SystemTools *)"%b %d %H:%M:%S %z",format);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,local_798._M_dataplus._M_p,local_798._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"</StartDateTime>",0x10);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"      <StartBuildTime>",0x16);
        kwssys::SystemTools::GetTime();
        std::ostream::_M_insert<unsigned_long>((ulong)&local_640);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"</StartBuildTime>",0x11);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"<BuildCommand>KWStyle</BuildCommand>",0x24);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        cVar4 = (char)(ostream *)&local_640;
        std::ostream::put(cVar4);
        std::ostream::flush();
        __x = (local_7c8->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
              _M_impl.super__Vector_impl_data._M_start;
        local_7cc = 0;
        do {
          if (__x == (local_7c8->m_Parsers->
                     super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>)._M_impl.
                     super__Vector_impl_data._M_finish) break;
          local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
          pcVar1 = (__x->m_Filename)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,pcVar1,pcVar1 + (__x->m_Filename)._M_string_length);
          if (local_6a0->_M_string_length != 0) {
            std::__cxx11::string::substr((ulong)&local_7c0,(ulong)&local_798);
            std::__cxx11::string::operator=((string *)&local_798,(string *)&local_7c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
              operator_delete(local_7c0._M_dataplus._M_p);
            }
          }
          local_778 = __x;
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                    (&local_678,&__x->m_ErrorList);
          local_7d0 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          pEVar13 = local_678.
                    super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            if (pEVar13 ==
                local_678.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish) break;
            if (((char)uVar11 == '\0') || ((local_7d0 & 1) != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"<Error>",7);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"          <BuildLogLine>1</BuildLogLine>",0x28);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"          <SourceFile>",0x16);
              _Var2._M_p = local_798._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_798._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::ios::clear((int)auStack_7d8 + (int)*(undefined8 *)(local_640 + -0x18) + 0x198);
              }
              else {
                sVar5 = strlen(local_798._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_640,_Var2._M_p,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"</SourceFile>",0xd);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"          <SourceLineNumber>",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_640);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"</SourceLineNumber>",0x13);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              if (local_730->_M_string_length != 0) {
                local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                pcVar1 = (local_778->m_Filename)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_7c0,pcVar1,
                           pcVar1 + (local_778->m_Filename)._M_string_length);
                lVar7 = std::__cxx11::string::find((char *)&local_7c0,0x1776f2,0);
                if (lVar7 != -1) {
                  std::__cxx11::string::substr((ulong)&local_770,(ulong)&local_7c0);
                  std::__cxx11::string::operator=((string *)&local_7c0,(string *)&local_770);
                  if (local_770 != &local_760) {
                    operator_delete(local_770);
                  }
                }
                lVar7 = std::__cxx11::string::find((char *)&local_7c0,0x175454,0);
                if (lVar7 != -1) {
                  std::__cxx11::string::substr((ulong)&local_770,(ulong)&local_7c0);
                  std::__cxx11::string::operator=((string *)&local_7c0,(string *)&local_770);
                  if (local_770 != &local_760) {
                    operator_delete(local_770);
                  }
                }
                uVar8 = std::__cxx11::string::find_last_of
                                  ((char *)&local_7c0,0x169531,0xffffffffffffffff);
                if ((uVar8 != 0xffffffffffffffff) && (local_7c8->m_MaxDirectoryDepth != 0)) {
                  uVar12 = 1;
                  do {
                    std::__cxx11::string::replace((ulong)&local_7c0,uVar8,(char *)0x1,0x176e58);
                    uVar8 = std::__cxx11::string::find_last_of
                                      ((char *)&local_7c0,0x169531,0xffffffffffffffff);
                    if (uVar8 == 0xffffffffffffffff) break;
                    bVar14 = uVar12 < local_7c8->m_MaxDirectoryDepth;
                    uVar12 = uVar12 + 1;
                  } while (bVar14);
                }
                lVar7 = std::__cxx11::string::find_last_of
                                  ((char *)&local_7c0,0x169531,0xffffffffffffffff);
                if (lVar7 != -1) {
                  std::__cxx11::string::substr((ulong)&local_770,(ulong)&local_7c0);
                  std::__cxx11::string::operator=((string *)&local_7c0,(string *)&local_770);
                  if (local_770 != &local_760) {
                    operator_delete(local_770);
                  }
                }
                std::__cxx11::string::append((char *)&local_7c0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"<Url>",5);
                pcVar6 = (local_730->_M_dataplus)._M_p;
                if (pcVar6 == (char *)0x0) {
                  std::ios::clear((int)auStack_7d8 + (int)*(undefined8 *)(local_640 + -0x18) + 0x198
                                 );
                }
                else {
                  sVar5 = strlen(pcVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_640,pcVar6,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"/",1);
                _Var2._M_p = local_7c0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c0._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::ios::clear((int)auStack_7d8 + (int)*(undefined8 *)(local_640 + -0x18) + 0x198
                                 );
                }
                else {
                  sVar5 = strlen(local_7c0._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_640,_Var2._M_p,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"</Url>",6)
                ;
                std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
                std::ostream::put(cVar4);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_640,"<UrlName>View KWStyle File</UrlName>",0x24);
                std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
                std::ostream::put(cVar4);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
                  operator_delete(local_7c0._M_dataplus._M_p);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"          <Text>",0x10);
              local_7d0 = 0;
            }
            _Var2._M_p = local_798._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_798._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::ios::clear((int)auStack_7d8 + (int)*(undefined8 *)(local_640 + -0x18) + 0x198);
            }
            else {
              sVar5 = strlen(local_798._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,_Var2._M_p,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640," : ",3);
            Parser::GetErrorTag_abi_cxx11_(&local_7c0,local_778,pEVar13->number);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,local_7c0._M_dataplus._M_p,local_7c0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
              operator_delete(local_7c0._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640," : ",3);
            local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
            pcVar1 = (pEVar13->description)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_7c0,pcVar1,pcVar1 + (pEVar13->description)._M_string_length)
            ;
            for (uVar8 = std::__cxx11::string::find((char *)&local_7c0,0x175d38,0);
                uVar8 != 0xffffffffffffffff;
                uVar8 = std::__cxx11::string::find((char *)&local_7c0,0x175d38,uVar8 + 3)) {
              std::__cxx11::string::replace((ulong)&local_7c0,uVar8,(char *)0x1,0x175d3a);
            }
            while (uVar8 = std::__cxx11::string::find((char *)&local_7c0,0x176488,0),
                  uVar8 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&local_7c0,uVar8,(char *)0x1,0x175d40);
            }
            while (uVar8 = std::__cxx11::string::find((char *)&local_7c0,0x1759b2,0),
                  uVar8 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&local_7c0,uVar8,(char *)0x1,0x175d48);
            }
            Parser::GetTestDescription_abi_cxx11_(&local_660,local_778,pEVar13->number);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_660,0,(char *)0x0,0x1690a2)
            ;
            local_6e8 = &local_6d8;
            plVar10 = plVar9 + 2;
            if ((long *)*plVar9 == plVar10) {
              local_6d8 = *plVar10;
              lStack_6d0 = plVar9[3];
            }
            else {
              local_6d8 = *plVar10;
              local_6e8 = (long *)*plVar9;
            }
            local_6e0 = plVar9[1];
            *plVar9 = (long)plVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_6e8);
            local_770 = &local_760;
            plVar10 = plVar9 + 2;
            if ((long *)*plVar9 == plVar10) {
              local_760 = *plVar10;
              lStack_758 = plVar9[3];
            }
            else {
              local_760 = *plVar10;
              local_770 = (long *)*plVar9;
            }
            local_768 = plVar9[1];
            *plVar9 = (long)plVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_770);
            if (local_770 != &local_760) {
              operator_delete(local_770);
            }
            if (local_6e8 != &local_6d8) {
              operator_delete(local_6e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_660._M_dataplus._M_p != &local_660.field_2) {
              operator_delete(local_660._M_dataplus._M_p);
            }
            pcVar6 = (char *)operator_new__(0xff);
            snprintf(pcVar6,0xff,"%ld",pEVar13->line);
            std::__cxx11::string::append((char *)&local_7c0);
            std::__cxx11::string::append((char *)&local_7c0);
            operator_delete__(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,local_7c0._M_dataplus._M_p,local_7c0._M_string_length);
            if ((char)uVar11 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"</Text>",7);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"          <PreContext>",0x16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"</PreContext>",0xd);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"<PostContext>",0xd);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"</PostContext>",0xe);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_640,"<RepeatCount>0</RepeatCount>",0x1c);
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"</Error>",8)
              ;
              std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
            }
            bVar15 = local_79c == -1;
            local_7cc = local_7cc + 1;
            bVar14 = local_7cc < local_79c;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
              operator_delete(local_7c0._M_dataplus._M_p);
            }
            pEVar13 = pEVar13 + 1;
            uVar11 = local_7a0;
          } while (bVar15 || bVar14);
          if (((char)uVar11 != '\0') && ((local_7d0 & 1) == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"</Text>",7);
            std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,"          <PreContext>",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,"</PreContext>",0xd);
            std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,"<PostContext>",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,"</PostContext>",0xe);
            std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_640,"<RepeatCount>0</RepeatCount>",0x1c);
            std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"</Error>",8);
            std::ios::widen((char)*(undefined8 *)(local_640 + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
          }
          bVar15 = local_79c == -1;
          bVar14 = local_7cc < local_79c;
          __x = local_778;
          if (bVar14 || bVar15) {
            __x = local_778 + 1;
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&local_678);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p);
          }
        } while (bVar14 || bVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640," <Log Encoding=\"base64\" Compression=\"/bin/gzip\">",0x30
                  );
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"      </Log>",0xc)
        ;
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"      <EndDateTime>",0x13);
        kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
                  (&local_798,(SystemTools *)"%b %d %I:%M:%S %z",format_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,local_798._M_dataplus._M_p,local_798._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"</EndDateTime>",0xe);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        local_7c8 = (Generator *)kwssys::SystemTools::GetTime();
        pcVar6 = (char *)operator_new__(10);
        snprintf(pcVar6,10,"%.1f",((double)local_7c8 - local_6a8) / 60.0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"  <ElapsedMinutes>",0x12);
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,pcVar6,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_640,"</ElapsedMinutes></Build>",0x19);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,"</Site>",7);
        std::ios::widen((char)(ostream *)&local_640 + (char)*(undefined8 *)(local_640 + -0x18));
        std::ostream::put((char)&local_640);
        std::ostream::flush();
        operator_delete__(pcVar6);
        std::ifstream::close();
        std::ofstream::close();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        if (local_698 != local_688) {
          operator_delete(local_698);
        }
      }
      if (local_6c8[0] != local_6b8) {
        operator_delete(local_6c8[0]);
      }
      local_640 = _VTT;
      *(undefined8 *)(local_638 + *(long *)(_VTT + -0x18) + -8) = _getpwnam;
      std::filebuf::~filebuf(local_638);
      std::ios_base::~ios_base(local_548);
    }
    std::ifstream::~ifstream(local_440);
    if (local_728[0] != local_718) {
      operator_delete(local_728[0]);
    }
  }
  std::ifstream::~ifstream(local_238);
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0]);
  }
  if (local_750 != local_740) {
    operator_delete(local_750);
  }
  return SUB41(local_7d4,0);
}

Assistant:

bool Generator::GenerateDart(const char* dir,int maxError,
                             bool group,std::string url,
                             double time,std::string basedirectory)
{
  std::cout << "Generating Dart...";

  // We try to find the TAG file
  std::string dirname = dir;
  if(dir[strlen(dir)-1] != '/' && dir[strlen(dir)-1] != '\\')
    {
     dirname += "/";
    }
  dirname += "Testing/";

  std::string tag = dirname+"TAG";

  std::ifstream tagfile;
  tagfile.open(tag.c_str(), std::ios::binary | std::ios::in);
  if(!tagfile.is_open())
    {
    std::cout << "Cannot open file for reading: " << tag.c_str() << std::endl;
    return false;
    }

  // We read the first line of the file which gives the path to the actual
  // directory
  char* bufferTag = new char[255];
  tagfile.getline(bufferTag,255);

  if(bufferTag[strlen(bufferTag)-1] == '\r')
    {
    bufferTag[strlen(bufferTag)-1] = '\0';
    }

  dirname += bufferTag;
  dirname += "/";

  delete [] bufferTag;

  // We should have a Configure.xml file in the directory
  std::string configname = dirname+"Configure.xml";

  std::ifstream configfile;

  configfile.open(configname.c_str(), std::ios::binary | std::ios::in);
  if(!configfile.is_open())
    {
    std::cout << "Cannot open file for reading: " << configname.c_str() << std::endl;
    return false;
    }

  // Create the Build.xml file
  std::ofstream file;
  std::string filename = dirname+"Build.xml";

  file.open(filename.c_str(), std::ios::binary | std::ios::out);
  if(!file.is_open())
    {
    std::cout << "Cannot open file for writing: " <<  std::endl;
    return false;
    }

  // Generate the header
  char* buffer = new char[255];
  configfile.getline(buffer,255);
  file << buffer << std::endl;
  configfile.getline(buffer,255);
  file << buffer << std::endl;

  std::string currentLine = buffer;
  while(currentLine.find(">") == std::string::npos)
   {
   configfile.getline(buffer,255);
   currentLine = buffer;
   file << buffer << std::endl;
   }

  delete [] buffer;

  file << "<Build>" << std::endl;
  file << "      <StartDateTime>";
  file << kwssys::SystemTools::GetCurrentDateTime("%b %d %H:%M:%S %z");
  file << "</StartDateTime>" << std::endl;
  file << "      <StartBuildTime>";
  file << static_cast<unsigned int>(kwssys::SystemTools::GetTime());
  file << "</StartBuildTime>" << std::endl;
  file << "<BuildCommand>KWStyle</BuildCommand>" << std::endl;

  int nErrors = 0;
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    std::string sourcefile = (*it).GetFilename();
    if (!basedirectory.empty()) {
      sourcefile = sourcefile.substr(basedirectory.size());
    }

    bool first = true;
    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while(itError != errors.end())
      {
      if((!group) || (first && group))
        {
        file << "<Error>" << std::endl;
        file << "          <BuildLogLine>1</BuildLogLine>" << std::endl;
        file << "          <SourceFile>";
        file << sourcefile.c_str();
        file << "</SourceFile>" << std::endl;
        file << "          <SourceLineNumber>";
        file << (*itError).line;
        file << "</SourceLineNumber>" << std::endl;

        if (!url.empty()) {
          // We had a link to the dashboard
          /*long int posslash = (*it).GetFilename().find_last_of("/");
          long int posbackslash = (*it).GetFilename().find_last_of("\\");

          long int pos = 0;
          if(posslash != -1 && posslash>posbackslash)
            {
            pos = posslash;
            }

          if(posbackslash != -1 && posbackslash>posslash)
            {
            pos = posbackslash;
            }

          if(pos == 0)
            {
            pos++;
            }
          std::string htmlfile = (*it).GetFilename().substr(pos+1,(*it).GetFilename().size()-pos-1);
          */

          std::string htmlfile = (*it).GetFilename();
          if(long int pos = htmlfile.find(":/") != std::string::npos)
            {
            htmlfile = htmlfile.substr(pos+2,htmlfile.size()-pos-2);
            }
          if(long int pos = htmlfile.find(":\\") != std::string::npos)
            {
            htmlfile = htmlfile.substr(pos+2,htmlfile.size()-pos-2);
            }

            auto slash = static_cast<long int>(htmlfile.find_last_of("/"));
            unsigned int i = 0;
            while (slash != -1 && i < m_MaxDirectoryDepth) {
              htmlfile.replace(slash, 1, "_");
              slash = static_cast<long int>(htmlfile.find_last_of("/"));
              i++;
            }
          slash = static_cast<long int>(htmlfile.find_last_of("/"));
          if(slash != -1)
            {
            htmlfile = htmlfile.substr(slash+1,htmlfile.size()-slash-1);
            }

          htmlfile += ".html";
          file << "<Url>"<< url.c_str() << "/" << htmlfile.c_str() << "</Url>" << std::endl;
          file << "<UrlName>View KWStyle File</UrlName>" << std::endl;
        }
        first = false;
        file << "          <Text>";
        }

      file << sourcefile.c_str();
      file << " : ";
      file << (*it).GetErrorTag((*itError).number);
      file << " : ";
      std::string desc = (*itError).description;
      auto pos = static_cast<long int>(desc.find("&", 0));
      while(pos != -1)
        {
        desc.replace(pos,1,"&amp;");
        pos = static_cast<long int>(desc.find("&",pos+3));
        }
      pos = static_cast<long int>(desc.find("<"));
      while(pos != -1)
        {
        desc.replace(pos,1,"&#x03C;");
        pos = static_cast<long int>(desc.find("<"));
        }
      pos = static_cast<long int>(desc.find(">"));
      while(pos != -1)
        {
        desc.replace(pos,1,"&#x03E;");
        pos = static_cast<long int>(desc.find(">"));
        }

      desc += " ["+(*it).GetTestDescription((*itError).number)+"] (";
      constexpr size_t length = 255;
      char* val = new char[length];
      snprintf(val,length,"%ld",(*itError).line);
      desc += val;
      desc += ")\n";
      delete [] val;

      file << desc;

      if(!group)
        {
        file << "</Text>" << std::endl;
        // Show the actual error in the precontext
        file << "          <PreContext>";
        //file << (*it).GetTestDescription((*itError).number) << std::endl;
        file << "</PreContext>" << std::endl;
        file << "<PostContext>";
        file << "</PostContext>" << std::endl;
        file << "<RepeatCount>0</RepeatCount>" << std::endl;
        file << "</Error>" << std::endl;
        }
      itError++;
      nErrors++;
      if((maxError != -1) && (nErrors >= maxError))
        {
        break;
        }
      }

    if(group && !first)
      {
      file << "</Text>" << std::endl;
      // Show the actual error in the precontext
      file << "          <PreContext>";
      //file << (*it).GetTestDescription((*itError).number) << std::endl;
      file << "</PreContext>" << std::endl;
      file << "<PostContext>";
      file << "</PostContext>" << std::endl;
      file << "<RepeatCount>0</RepeatCount>" << std::endl;
      file << "</Error>" << std::endl;
      }

    if((maxError != -1) && (nErrors >= maxError))
      {
      break;
      }
    it++;
    }

  // Write the footer
    file << R"( <Log Encoding="base64" Compression="/bin/gzip">)" << std::endl;
    file << "      </Log>" << std::endl;
    file << "      <EndDateTime>";
    file << kwssys::SystemTools::GetCurrentDateTime("%b %d %I:%M:%S %z");
    file << "</EndDateTime>" << std::endl;

    double time1 = kwssys::SystemTools::GetTime();

    constexpr size_t length = 10;
    char *timestr = new char[length];
    snprintf(timestr, length, "%.1f", (time1 - time) / 60.0);

    file << "  <ElapsedMinutes>" << timestr << "</ElapsedMinutes></Build>"
         << std::endl;
    file << "</Site>" << std::endl;

    delete[] timestr;
    configfile.close();
    file.close();
    std::cout << "Done." << std::endl;
    return true;
 }